

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O3

void G_DoCompleted(void)

{
  byte *pbVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  FTextureID FVar8;
  int iVar9;
  level_info_t *plVar10;
  int *piVar11;
  cluster_info_t *cluster;
  cluster_info_t *pcVar12;
  wbplayerstruct_t *pwVar13;
  long lVar14;
  EFinishLevelType mode;
  uint uVar15;
  
  gameaction = ga_nothing;
  if (((uint)(gamestate + GS_FORCEWIPEBURN) < 2) || (gamestate == GS_STARTUP)) {
    return;
  }
  if (gamestate == GS_TITLELEVEL) {
    FString::operator=(&level.MapName,&nextlevel);
    G_DoLoadLevel(startpos,false);
    viewactive = true;
    startpos = 0;
    return;
  }
  if ((level.flags._3_1_ & 0x40) == 0) {
    plVar10 = FindLevelInfo(level.MapName.Chars,true);
    pbVar1 = (byte *)((long)&plVar10->flags + 3);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if (automapactive == true) {
    AM_Stop();
  }
  wminfo.finished_ep = level.cluster + -1;
  FVar8 = FTextureManager::CheckForTexture(&TexMan,((level.info)->PName).Chars,8,1);
  if ((uint)FVar8.texnum < TexMan.Textures.Count) {
    wminfo.LName0 = TexMan.Textures.Array[FVar8.texnum].Texture;
  }
  else {
    wminfo.LName0 = (FTexture *)0x0;
  }
  FString::operator=(&wminfo.current,&level.MapName);
  if (((deathmatch.Value == 0) || (((byte)dmflags.Value & 0x40) == 0)) ||
     ((level.flags._3_1_ & 0x40) != 0)) {
    plVar10 = FindLevelInfo(nextlevel.Chars,false);
    if ((plVar10 == (level_info_t *)0x0) ||
       (iVar9 = strncmp(nextlevel.Chars,"enDSeQ",6), iVar9 == 0)) {
      FString::operator=(&wminfo.next,&nextlevel);
    }
    else {
      FString::operator=(&wminfo.next,&plVar10->MapName);
      FVar8 = FTextureManager::CheckForTexture(&TexMan,(plVar10->PName).Chars,8,1);
      if ((uint)FVar8.texnum < TexMan.Textures.Count) {
        wminfo.LName1 = TexMan.Textures.Array[FVar8.texnum].Texture;
        goto LAB_0038fa54;
      }
    }
    wminfo.LName1 = (FTexture *)0x0;
  }
  else {
    FString::operator=(&wminfo.next,&level.MapName);
    wminfo.LName1 = wminfo.LName0;
  }
LAB_0038fa54:
  CheckWarpTransMap(&wminfo.next,true);
  FString::operator=(&nextlevel,&wminfo.next);
  plVar10 = FindLevelInfo(wminfo.next.Chars,true);
  wminfo.next_ep = plVar10->cluster + -1;
  wminfo.maxkills = level.total_monsters;
  wminfo.maxitems = level.total_items;
  wminfo.maxsecret = level.total_secrets;
  wminfo.partime = level.partime * 0x23;
  wminfo.maxfrags = 0;
  wminfo.sucktime = level.sucktime;
  wminfo.pnum = consoleplayer;
  wminfo.totaltime = level.totaltime;
  piVar11 = &DAT_017e1f40;
  pwVar13 = wminfo.plyr;
  lVar14 = 0;
  iVar9 = level.time;
  do {
    pwVar13->in = playeringame[lVar14];
    iVar7 = piVar11[-1];
    pwVar13->skills = piVar11[-2];
    pwVar13->sitems = iVar7;
    pwVar13->ssecret = *piVar11;
    pwVar13->stime = iVar9;
    uVar3 = *(undefined8 *)(piVar11 + -0x15);
    uVar4 = *(undefined8 *)(piVar11 + -0x13);
    uVar5 = *(undefined8 *)(piVar11 + -0x11);
    *(undefined8 *)pwVar13->frags = *(undefined8 *)(piVar11 + -0x17);
    *(undefined8 *)(pwVar13->frags + 2) = uVar3;
    *(undefined8 *)(pwVar13->frags + 4) = uVar4;
    *(undefined8 *)(pwVar13->frags + 6) = uVar5;
    pwVar13->fragcount = piVar11[-0xf];
    lVar14 = lVar14 + 1;
    piVar11 = piVar11 + 0xa8;
    pwVar13 = pwVar13 + 1;
  } while (lVar14 != 8);
  cluster = FindClusterInfo(level.cluster);
  pcVar12 = FindClusterInfo(wminfo.next_ep + 1);
  if (((cluster == pcVar12) && (deathmatch.Value == 0)) && ((cluster->flags & 1) != 0)) {
    uVar15 = 0;
    bVar6 = true;
    mode = FINISH_SameHub;
  }
  else {
    uVar15 = pcVar12->flags & 1;
    mode = FINISH_NoHub - uVar15;
    bVar6 = false;
  }
  G_LeavingHub(mode,cluster,&wminfo);
  lVar14 = 0;
  do {
    if (playeringame[lVar14] == true) {
      G_PlayerFinishLevel((int)lVar14,mode,changeflags);
    }
    plVar10 = level.info;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 8);
  if (bVar6) {
    if ((int)level.flags2 < 0) {
      (plVar10->Snapshot).mSize = 0;
      (plVar10->Snapshot).mCompressedSize = 0;
      pcVar2 = (plVar10->Snapshot).mBuffer;
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
        (plVar10->Snapshot).mBuffer = (char *)0x0;
      }
    }
    else {
      G_SnapshotLevel();
      FBehavior::StaticLockLevelVarStrings();
    }
  }
  else {
    G_ClearSnapshots();
    if ((char)uVar15 != '\0') {
      P_ClearACSVars(false);
    }
    level.time = 0;
    level.maptime = 0;
  }
  if ((deathmatch.Value == 0) &&
     ((((byte)level.flags & 1) != 0 || ((cluster == pcVar12 && ((cluster->flags & 1) != 0)))))) {
    G_WorldDone();
    return;
  }
  gamestate = GS_INTERMISSION;
  viewactive = false;
  automapactive = false;
  WI_Start(&wminfo);
  return;
}

Assistant:

void G_DoCompleted (void)
{
	int i; 

	gameaction = ga_nothing;

	if (   gamestate == GS_DEMOSCREEN
		|| gamestate == GS_FULLCONSOLE
		|| gamestate == GS_STARTUP)
	{
		return;
	}

	if (gamestate == GS_TITLELEVEL)
	{
		level.MapName = nextlevel;
		G_DoLoadLevel (startpos, false);
		startpos = 0;
		viewactive = true;
		return;
	}

	// [RH] Mark this level as having been visited
	if (!(level.flags & LEVEL_CHANGEMAPCHEAT))
		FindLevelInfo (level.MapName)->flags |= LEVEL_VISITED;

	if (automapactive)
		AM_Stop ();

	wminfo.finished_ep = level.cluster - 1;
	wminfo.LName0 = TexMan[TexMan.CheckForTexture(level.info->PName, FTexture::TEX_MiscPatch)];
	wminfo.current = level.MapName;

	if (deathmatch &&
		(dmflags & DF_SAME_LEVEL) &&
		!(level.flags & LEVEL_CHANGEMAPCHEAT))
	{
		wminfo.next = level.MapName;
		wminfo.LName1 = wminfo.LName0;
	}
	else
	{
		level_info_t *nextinfo = FindLevelInfo (nextlevel, false);
		if (nextinfo == NULL || strncmp (nextlevel, "enDSeQ", 6) == 0)
		{
			wminfo.next = nextlevel;
			wminfo.LName1 = NULL;
		}
		else
		{
			wminfo.next = nextinfo->MapName;
			wminfo.LName1 = TexMan[TexMan.CheckForTexture(nextinfo->PName, FTexture::TEX_MiscPatch)];
		}
	}

	CheckWarpTransMap (wminfo.next, true);
	nextlevel = wminfo.next;

	wminfo.next_ep = FindLevelInfo (wminfo.next)->cluster - 1;
	wminfo.maxkills = level.total_monsters;
	wminfo.maxitems = level.total_items;
	wminfo.maxsecret = level.total_secrets;
	wminfo.maxfrags = 0;
	wminfo.partime = TICRATE * level.partime;
	wminfo.sucktime = level.sucktime;
	wminfo.pnum = consoleplayer;
	wminfo.totaltime = level.totaltime;

	for (i=0 ; i<MAXPLAYERS ; i++)
	{
		wminfo.plyr[i].in = playeringame[i];
		wminfo.plyr[i].skills = players[i].killcount;
		wminfo.plyr[i].sitems = players[i].itemcount;
		wminfo.plyr[i].ssecret = players[i].secretcount;
		wminfo.plyr[i].stime = level.time;
		memcpy (wminfo.plyr[i].frags, players[i].frags
				, sizeof(wminfo.plyr[i].frags));
		wminfo.plyr[i].fragcount = players[i].fragcount;
	}

	// [RH] If we're in a hub and staying within that hub, take a snapshot
	//		of the level. If we're traveling to a new hub, take stuff from
	//		the player and clear the world vars. If this is just an
	//		ordinary cluster (not a hub), take stuff from the player, but
	//		leave the world vars alone.
	cluster_info_t *thiscluster = FindClusterInfo (level.cluster);
	cluster_info_t *nextcluster = FindClusterInfo (wminfo.next_ep+1);	// next_ep is cluster-1
	EFinishLevelType mode;

	if (thiscluster != nextcluster || deathmatch ||
		!(thiscluster->flags & CLUSTER_HUB))
	{
		if (nextcluster->flags & CLUSTER_HUB)
		{
			mode = FINISH_NextHub;
		}
		else
		{
			mode = FINISH_NoHub;
		}
	}
	else
	{
		mode = FINISH_SameHub;
	}

	// Intermission stats for entire hubs
	G_LeavingHub(mode, thiscluster, &wminfo);

	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
		{ // take away appropriate inventory
			G_PlayerFinishLevel (i, mode, changeflags);
		}
	}

	if (mode == FINISH_SameHub)
	{ // Remember the level's state for re-entry.
		if (!(level.flags2 & LEVEL2_FORGETSTATE))
		{
			G_SnapshotLevel ();
			// Do not free any global strings this level might reference
			// while it's not loaded.
			FBehavior::StaticLockLevelVarStrings();
		}
		else
		{ // Make sure we don't have a snapshot lying around from before.
			level.info->Snapshot.Clean();
		}
	}
	else
	{ // Forget the states of all existing levels.
		G_ClearSnapshots ();

		if (mode == FINISH_NextHub)
		{ // Reset world variables for the new hub.
			P_ClearACSVars(false);
		}
		level.time = 0;
		level.maptime = 0;
	}

	if (!deathmatch &&
		((level.flags & LEVEL_NOINTERMISSION) ||
		((nextcluster == thiscluster) && (thiscluster->flags & CLUSTER_HUB))))
	{
		G_WorldDone ();
		return;
	}

	gamestate = GS_INTERMISSION;
	viewactive = false;
	automapactive = false;

// [RH] If you ever get a statistics driver operational, adapt this.
//	if (statcopy)
//		memcpy (statcopy, &wminfo, sizeof(wminfo));

	WI_Start (&wminfo);
}